

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O0

void gimage::anon_unknown_8::writeRAWHeader(char *name,int type,long width,long height)

{
  long lVar1;
  char *pcVar2;
  char *in_RDI;
  bool *in_stack_00000080;
  char *in_stack_00000088;
  Properties *in_stack_00000090;
  string s;
  Properties prop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [39];
  allocator local_81;
  string local_80 [35];
  undefined1 local_5d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [72];
  char *local_8;
  
  __rhs = local_50;
  local_8 = in_RDI;
  gutil::Properties::Properties((Properties *)0x145008);
  gutil::Properties::putValue<long>(in_stack_00000090,in_stack_00000088,(long *)in_stack_00000080);
  gutil::Properties::putValue<long>(in_stack_00000090,in_stack_00000088,(long *)in_stack_00000080);
  gutil::Properties::putValue<int>(in_stack_00000090,in_stack_00000088,(int *)in_stack_00000080);
  local_5d = 0;
  gutil::Properties::putValue<bool>(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  pcVar2 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,pcVar2,&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  lVar1 = std::__cxx11::string::length();
  std::__cxx11::string::replace((ulong)local_80,lVar1 - 4,(char *)0x4);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"Header information of RAW File: ",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,local_8,(allocator *)&stack0xffffffffffffff0f);
  std::operator+(in_stack_ffffffffffffff08,__rhs);
  std::__cxx11::string::c_str();
  gutil::Properties::save((char *)local_50,pcVar2);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string(local_80);
  gutil::Properties::~Properties((Properties *)0x1451f0);
  return;
}

Assistant:

void writeRAWHeader(const char *name, int type, long width, long height)
{
  gutil::Properties prop;

  prop.putValue("image.width", width);
  prop.putValue("image.height", height);
  prop.putValue("image.pixelsize", type);
  prop.putValue("image.msbfirst", false);

  std::string s=name;
  s.replace(s.length()-4, 4, ".hdr");

  prop.save(s.c_str(), (std::string("Header information of RAW File: ")+std::string(name)).c_str());
}